

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase828::run(TestCase828 *this)

{
  Builder output;
  Field field;
  SegmentBuilder *pSVar1;
  PointerType PVar2;
  undefined1 *puVar3;
  undefined1 auVar4 [8];
  Type type;
  Reader value;
  Reader value_00;
  ArrayPtr<const_char> input;
  StringPtr name;
  String encoded;
  Builder root;
  DebugComparison<kj::String_&,_const_char_(&)[52]> _kjCondition;
  JsonCodec json;
  Builder nested;
  DebugExpression<bool> _kjCondition_5;
  TestStructHandler handler;
  MallocMessageBuilder message;
  undefined1 local_298 [8];
  SegmentBuilder *pSStack_290;
  WirePointer *local_288;
  undefined1 local_278 [16];
  WirePointer *local_268;
  WirePointer *local_260;
  bool local_258;
  bool local_248;
  undefined1 local_238 [48];
  JsonCodec local_208;
  StructBuilder local_1f8;
  PointerBuilder local_1c8;
  char *local_1b0;
  HandlerBase local_1a8;
  undefined **local_1a0;
  Builder local_198;
  undefined8 local_180;
  SegmentBuilder *pSStack_178;
  SegmentBuilder *pSStack_170;
  WirePointer *pWStack_168;
  WirePointer *pWStack_160;
  StructDataBitCount local_158;
  StructPointerCount SStack_154;
  undefined2 uStack_152;
  Field local_150;
  MallocMessageBuilder local_110;
  
  local_1a8._vptr_HandlerBase = (_func_int **)&PTR_encodeBase_006bebd8;
  local_1a0 = &PTR_encodeBase_006bec30;
  JsonCodec::JsonCodec(&local_208);
  local_110.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)(schemas::s_95b30dd14e01dda8 + 0x48);
  name.content.size_ = 5;
  name.content.ptr = "old3";
  StructSchema::getFieldByName(&local_150,(StructSchema *)&local_110,name);
  field.index = local_150.index;
  field._12_4_ = local_150._12_4_;
  field.parent.super_Schema.raw = local_150.parent.super_Schema.raw;
  field.proto._reader.segment = local_150.proto._reader.segment;
  field.proto._reader.capTable = local_150.proto._reader.capTable;
  field.proto._reader.data = local_150.proto._reader.data;
  field.proto._reader.pointers = local_150.proto._reader.pointers;
  field.proto._reader.dataSize = local_150.proto._reader.dataSize;
  field.proto._reader.pointerCount = local_150.proto._reader.pointerCount;
  field.proto._reader._38_2_ = local_150.proto._reader._38_2_;
  field.proto._reader.nestingLimit = local_150.proto._reader.nestingLimit;
  field.proto._reader._44_4_ = local_150.proto._reader._44_4_;
  type.field_4.schema = (RawBrandedSchema *)(schemas::s_95b30dd14e01dda8 + 0x48);
  type.baseType = STRUCT;
  type.listDepth = '\0';
  type.isImplicitParam = false;
  type.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  type._6_2_ = 0;
  JsonCodec::addFieldHandlerImpl(&local_208,field,type,&local_1a8);
  local_298 = (undefined1  [8])0x0;
  pSStack_290 = (SegmentBuilder *)0x0;
  local_288 = (WirePointer *)0x0;
  MallocMessageBuilder::MallocMessageBuilder(&local_110,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_238,&local_110.super_MessageBuilder);
  local_1f8.data = (void *)local_238._16_8_;
  local_1f8.segment = (SegmentBuilder *)local_238._0_8_;
  local_1f8.capTable = (CapTableBuilder *)local_238._8_8_;
  PointerBuilder::getStruct
            ((StructBuilder *)local_278,(PointerBuilder *)&local_1f8,(StructSize)0x20001,(word *)0x0
            );
  local_268->offsetAndKind = 0x7b;
  local_268->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  local_1f8.segment = (SegmentBuilder *)local_278._0_8_;
  local_1f8.capTable = (CapTableBuilder *)local_278._8_8_;
  local_1f8.data = local_260;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_1f8,value);
  local_238._16_8_ = local_260 + 1;
  local_238._0_8_ = local_278._0_8_;
  local_238._8_8_ = local_278._8_8_;
  PointerBuilder::initStruct(&local_1f8,(PointerBuilder *)local_238,(StructSize)0x20001);
  local_238._0_8_ = local_1f8.segment;
  local_238._8_8_ = local_1f8.capTable;
  local_238._16_8_ = local_1f8.pointers;
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "bar";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_238,value_00);
  JsonCodec::encode<capnproto_test::capnp::test::TestOldVersion::Builder&>
            ((String *)local_238,&local_208,(Builder *)local_278);
  pSVar1 = pSStack_290;
  auVar4 = local_298;
  if (local_298 != (undefined1  [8])0x0) {
    local_298 = (undefined1  [8])0x0;
    pSStack_290 = (SegmentBuilder *)0x0;
    (*(code *)**(undefined8 **)local_288)(local_288,auVar4,1,pSVar1,pSVar1,0);
  }
  local_1c8.segment = (SegmentBuilder *)local_298;
  local_298 = (undefined1  [8])local_238._0_8_;
  pSStack_290 = (SegmentBuilder *)local_238._8_8_;
  local_288 = (WirePointer *)local_238._16_8_;
  kj::_::DebugExpression<kj::String&>::operator==
            ((DebugComparison<kj::String_&,_const_char_(&)[52]> *)local_238,
             (DebugExpression<kj::String&> *)&local_1c8,
             (char (*) [52])"{\"old1\":\"123\",\"old2\":\"foo\",\"old3\":[\"0\",\"bar\",null]}");
  if ((local_238[0x20] == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[96],kj::_::DebugComparison<kj::String&,char_const(&)[52]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json-test.c++"
               ,0x34e,ERROR,
               "\"failed: expected \" \"encoded == \\\"{\\\\\\\"old1\\\\\\\":\\\\\\\"123\\\\\\\",\\\\\\\"old2\\\\\\\":\\\\\\\"foo\\\\\\\",\\\\\\\"old3\\\\\\\":[\\\\\\\"0\\\\\\\",\\\\\\\"bar\\\\\\\",null]}\\\"\", _kjCondition"
               ,(char (*) [96])
                "failed: expected encoded == \"{\\\"old1\\\":\\\"123\\\",\\\"old2\\\":\\\"foo\\\",\\\"old3\\\":[\\\"0\\\",\\\"bar\\\",null]}\""
               ,(DebugComparison<kj::String_&,_const_char_(&)[52]> *)local_238);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_110);
  MallocMessageBuilder::MallocMessageBuilder(&local_110,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_238,&local_110.super_MessageBuilder);
  local_268 = (WirePointer *)local_238._16_8_;
  local_278._0_8_ = local_238._0_8_;
  local_278._8_8_ = local_238._8_8_;
  PointerBuilder::getStruct(&local_1f8,(PointerBuilder *)local_278,(StructSize)0x20001,(word *)0x0);
  auVar4 = (undefined1  [8])pSStack_290;
  if (pSStack_290 != (SegmentBuilder *)0x0) {
    auVar4 = local_298;
  }
  puVar3 = (undefined1 *)0x0;
  if (pSStack_290 != (SegmentBuilder *)0x0) {
    puVar3 = &pSStack_290[-1].field_0x37;
  }
  pSStack_178 = local_1f8.segment;
  pSStack_170 = (SegmentBuilder *)local_1f8.capTable;
  pWStack_168 = (WirePointer *)local_1f8.data;
  pWStack_160 = local_1f8.pointers;
  local_158 = local_1f8.dataSize;
  SStack_154 = local_1f8.pointerCount;
  uStack_152 = local_1f8._38_2_;
  local_180 = 0x6c0c40;
  output.builder.segment = local_1f8.segment;
  output.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x6c0c40;
  output.builder.capTable = local_1f8.capTable;
  output.builder.data = local_1f8.data;
  output.builder.pointers = local_1f8.pointers;
  output.builder.dataSize = local_1f8.dataSize;
  output.builder.pointerCount = local_1f8.pointerCount;
  output.builder._38_2_ = local_1f8._38_2_;
  input.size_ = (size_t)puVar3;
  input.ptr = (char *)auVar4;
  JsonCodec::decode(&local_208,input,output);
  local_278._0_8_ = *local_1f8.data;
  local_278._8_4_ = 0x7b;
  local_268 = (WirePointer *)0x4d6514;
  local_260 = (WirePointer *)&DAT_00000005;
  local_258 = (WirePointer)local_278._0_8_ == (WirePointer)0x7b;
  if ((!local_258) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39],kj::_::DebugComparison<long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json-test.c++"
               ,0x356,ERROR,"\"failed: expected \" \"root.getOld1() == 123\", _kjCondition",
               (char (*) [39])"failed: expected root.getOld1() == 123",
               (DebugComparison<long,_int> *)local_278);
  }
  local_198._0_8_ = "foo";
  local_238._0_8_ = local_1f8.segment;
  local_238._8_8_ = local_1f8.capTable;
  local_238._16_8_ = local_1f8.pointers;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&local_1c8,(PointerBuilder *)local_238,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_278,
             (DebugExpression<char_const(&)[4]> *)&local_198,(Builder *)&local_1c8);
  if ((local_248 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[41],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json-test.c++"
               ,0x357,ERROR,"\"failed: expected \" \"\\\"foo\\\" == root.getOld2()\", _kjCondition",
               (char (*) [41])"failed: expected \"foo\" == root.getOld2()",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_278);
  }
  local_268 = local_1f8.pointers + 1;
  local_278._0_8_ = local_1f8.segment;
  local_278._8_8_ = local_1f8.capTable;
  PointerBuilder::getStruct
            ((StructBuilder *)local_238,(PointerBuilder *)local_278,(StructSize)0x20001,(word *)0x0)
  ;
  local_278._0_8_ = *(undefined8 *)local_238._16_8_;
  local_278._8_8_ = local_278._8_8_ & 0xffffffff00000000;
  local_268 = (WirePointer *)0x4d6514;
  local_260 = (WirePointer *)&DAT_00000005;
  local_258 = (WirePointer)local_278._0_8_ == (WirePointer)0x0;
  if ((!local_258) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39],kj::_::DebugComparison<long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json-test.c++"
               ,0x359,ERROR,"\"failed: expected \" \"nested.getOld1() == 0\", _kjCondition",
               (char (*) [39])"failed: expected nested.getOld1() == 0",
               (DebugComparison<long,_int> *)local_278);
  }
  local_1b0 = "bar";
  local_1c8.segment = (SegmentBuilder *)local_238._0_8_;
  local_1c8.capTable = (CapTableBuilder *)local_238._8_8_;
  local_1c8.pointer = (WirePointer *)local_238._24_8_;
  PointerBuilder::getBlob<capnp::Text>(&local_198,&local_1c8,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_278,
             (DebugExpression<char_const(&)[4]> *)&local_1b0,&local_198);
  if ((local_248 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[43],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json-test.c++"
               ,0x35a,ERROR,
               "\"failed: expected \" \"\\\"bar\\\" == nested.getOld2()\", _kjCondition",
               (char (*) [43])"failed: expected \"bar\" == nested.getOld2()",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_278);
  }
  local_268 = (WirePointer *)(local_238._24_8_ + 8);
  local_278._0_8_ = local_238._0_8_;
  local_278._8_8_ = local_238._8_8_;
  PVar2 = PointerBuilder::getPointerType((PointerBuilder *)local_278);
  local_1c8.segment = (SegmentBuilder *)CONCAT71(local_1c8.segment._1_7_,PVar2 == NULL_);
  if ((PVar2 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json-test.c++"
               ,0x35b,ERROR,"\"failed: expected \" \"!nested.hasOld3()\", _kjCondition",
               (char (*) [35])"failed: expected !nested.hasOld3()",
               (DebugExpression<bool> *)&local_1c8);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_110);
  pSVar1 = pSStack_290;
  auVar4 = local_298;
  if (local_298 != (undefined1  [8])0x0) {
    local_298 = (undefined1  [8])0x0;
    pSStack_290 = (SegmentBuilder *)0x0;
    (**(code **)*local_288)(local_288,auVar4,1,pSVar1,pSVar1,0);
  }
  JsonCodec::~JsonCodec(&local_208);
  return;
}

Assistant:

void encode(const JsonCodec& codec, test::TestOldVersion::Reader input, JsonValue::Builder output) const override {
    dynamicHandler.encode(codec, input, output);
  }